

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_param_ref.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformParamRef(Transformer *this,PGParamRef *node)

{
  idx_t iVar1;
  size_type sVar2;
  pointer pPVar3;
  Transformer *this_00;
  unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>_>
  *new_count;
  long in_RDX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RDI;
  idx_t new_param_count;
  idx_t known_param_index;
  PreparedParam param;
  templated_unique_single_t expr;
  key_type *in_stack_fffffffffffffef8;
  Transformer *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  PreparedParamType type;
  string *psVar4;
  idx_t in_stack_ffffffffffffff10;
  idx_t *in_stack_ffffffffffffff18;
  Transformer *in_stack_ffffffffffffff20;
  Transformer *in_stack_ffffffffffffff28;
  undefined1 local_a1 [33];
  string local_80 [32];
  unsigned_long local_60;
  PGParamRef *in_stack_ffffffffffffffa8;
  string local_40 [40];
  long local_18;
  
  local_18 = in_RDX;
  make_uniq<duckdb::ParameterExpression>();
  GetParameterIdentifier(in_stack_ffffffffffffffa8);
  local_60 = 0xffffffffffffffff;
  GetParam(in_stack_ffffffffffffff28,(string *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
           (PreparedParamType)(in_stack_ffffffffffffff10 >> 0x38));
  if (local_60 == 0xffffffffffffffff) {
    if (*(int *)(local_18 + 4) == 0) {
      iVar1 = ParamCount(in_stack_ffffffffffffff00);
      local_60 = iVar1 + 1;
      if (*(long *)(local_18 + 0x10) == 0) {
        in_stack_ffffffffffffff20 = (Transformer *)local_a1;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)(local_a1 + 1),"%d",(allocator *)in_stack_ffffffffffffff20);
        StringUtil::Format<unsigned_long>
                  (in_stack_ffffffffffffff08,(unsigned_long)in_stack_ffffffffffffff00);
        ::std::__cxx11::string::operator=(local_40,local_80);
        ::std::__cxx11::string::~string(local_80);
        ::std::__cxx11::string::~string((string *)(local_a1 + 1));
        ::std::allocator<char>::~allocator((allocator<char> *)local_a1);
      }
      type = (PreparedParamType)((ulong)in_stack_ffffffffffffff08 >> 0x38);
    }
    else {
      local_60 = NumericCast<unsigned_long,int,void>(0);
      type = (PreparedParamType)((ulong)in_stack_ffffffffffffff08 >> 0x38);
    }
    sVar2 = ::std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (sVar2 == 0) {
      SetParam(in_stack_ffffffffffffff20,(string *)0x0,in_stack_ffffffffffffff10,type);
    }
  }
  psVar4 = local_40;
  pPVar3 = unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
                         *)in_stack_ffffffffffffff00);
  ::std::__cxx11::string::operator=((string *)&pPVar3->identifier,psVar4);
  this_00 = (Transformer *)ParamCount(in_stack_ffffffffffffff00);
  new_count = (unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>_>
               *)MaxValue<unsigned_long>((unsigned_long)this_00,local_60);
  SetParamCount(this_00,(idx_t)new_count);
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<duckdb::ParameterExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)this_00,new_count);
  anon_unknown_132::PreparedParam::~PreparedParam((PreparedParam *)0x1a15516);
  unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
               *)0x1a15523);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformParamRef(duckdb_libpgquery::PGParamRef &node) {
	auto expr = make_uniq<ParameterExpression>();

	auto param = GetParameterIdentifier(node);
	idx_t known_param_index = DConstants::INVALID_INDEX;
	// This is a named parameter, try to find an entry for it
	GetParam(param.identifier, known_param_index, param.type);

	if (known_param_index == DConstants::INVALID_INDEX) {
		// We have not seen this parameter before
		if (node.number != 0) {
			// Preserve the parameter number
			known_param_index = NumericCast<idx_t>(node.number);
		} else {
			known_param_index = ParamCount() + 1;
			if (!node.name) {
				param.identifier = StringUtil::Format("%d", known_param_index);
			}
		}

		if (!named_param_map.count(param.identifier)) {
			// Add it to the named parameter map so we can find it next time it's referenced
			SetParam(param.identifier, known_param_index, param.type);
		}
	}

	expr->identifier = param.identifier;
	idx_t new_param_count = MaxValue<idx_t>(ParamCount(), known_param_index);
	SetParamCount(new_param_count);
	return std::move(expr);
}